

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

MessageAnalysis __thiscall
google::protobuf::compiler::cpp::MessageSCCAnalyzer::GetSCCAnalysis
          (MessageSCCAnalyzer *this,SCC *scc)

{
  flat_hash_map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *this_00;
  FieldDescriptor FVar1;
  Descriptor *this_01;
  MessageSCCAnalyzer *this_02;
  bool bVar2;
  char cVar3;
  FileOptions_OptimizeMode FVar4;
  int iVar5;
  MessageAnalysis MVar6;
  pointer ppDVar7;
  FieldDescriptor *pFVar8;
  Descriptor *descriptor;
  SCC *scc_00;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  int index;
  bool bVar12;
  iterator it;
  bool local_80;
  SCC *local_78;
  flat_hash_map<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *local_70;
  ulong local_68;
  MessageSCCAnalyzer *local_60;
  iterator local_58;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>::iterator,_bool>
  local_48;
  
  this_00 = &this->analysis_cache_;
  local_78 = scc;
  local_58 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
             ::find<google::protobuf::compiler::SCC_const*>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
                         *)this_00,&local_78);
  local_48.first.ctrl_ = (ctrl_t *)0x0;
  bVar2 = absl::lts_20240722::container_internal::operator==(&local_58,&local_48.first);
  if (bVar2) {
    if ((this->options_).lite_implicit_weak_fields == true) {
      FVar4 = GetOptimizeFor(*(FileDescriptor **)
                              (*(local_78->descriptors).
                                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x10),&this->options_,
                             (bool *)0x0);
      bVar2 = FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME;
    }
    else {
      bVar2 = false;
    }
    ppDVar7 = (local_78->descriptors).
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_70 = this_00;
    if ((local_78->descriptors).
        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish == ppDVar7) {
      local_80 = false;
      bVar9 = false;
      bVar10 = false;
      bVar12 = false;
    }
    else {
      uVar11 = 0;
      bVar12 = false;
      bVar10 = false;
      bVar9 = false;
      local_80 = false;
      local_60 = this;
      do {
        this_01 = ppDVar7[uVar11];
        if (0 < *(int *)(this_01 + 0x88)) {
          bVar10 = true;
        }
        local_68 = uVar11;
        if (0 < *(int *)(this_01 + 4)) {
          index = 0;
          do {
            pFVar8 = Descriptor::field(this_01,index);
            cVar3 = google::protobuf::FieldDescriptor::is_required();
            if (cVar3 != '\0') {
              bVar12 = true;
            }
            if (*(char *)(*(long *)(pFVar8 + 0x38) + 0x8c) != '\0') {
              bVar2 = true;
            }
            FVar1 = pFVar8[2];
            if ((byte)FVar1 - 10 < 2) {
              descriptor = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
              this_02 = local_60;
              scc_00 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>
                       ::GetSCC(&local_60->analyzer_,descriptor);
              if (scc_00 == local_78) {
                local_80 = true;
              }
              else {
                MVar6 = GetSCCAnalysis(this_02,scc_00);
                bVar9 = (bool)(MVar6.contains_cord & 1U | bVar9);
                bVar10 = (bool)(MVar6.contains_extension & 1U | bVar10);
                bVar12 = (bool)(MVar6.contains_required & 1U | bVar12);
                bVar2 = (bool)(MVar6.contains_weak & 1U | bVar2);
              }
            }
            else if (((FVar1 == (FieldDescriptor)0xc) || (FVar1 == (FieldDescriptor)0x9)) &&
                    (iVar5 = google::protobuf::FieldDescriptor::cpp_string_type(), iVar5 == 2)) {
              bVar9 = true;
            }
            index = index + 1;
          } while (index < *(int *)(this_01 + 4));
        }
        uVar11 = local_68 + 1;
        ppDVar7 = (local_78->descriptors).
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(local_78->descriptors).
                                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar7 >>
                               3));
    }
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
    ::try_emplace_impl<google::protobuf::compiler::SCC_const*const&>(&local_48,local_70,&local_78);
    ((MessageAnalysis *)((long)local_48.first.field_1.slot_ + 8))->is_recursive = local_80;
    *(bool *)((long)local_48.first.field_1.slot_ + 9) = bVar9;
    *(bool *)((long)local_48.first.field_1.slot_ + 10) = bVar10;
    *(bool *)((long)local_48.first.field_1.slot_ + 0xb) = bVar12;
    *(bool *)((long)local_48.first.field_1.slot_ + 0xc) = bVar2;
  }
  else {
    local_48.first.field_1.slot_ =
         (slot_type *)
         absl::lts_20240722::container_internal::
         raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
         ::iterator::operator->(&local_58);
  }
  return *(MessageAnalysis *)((long)local_48.first.field_1.slot_ + 8);
}

Assistant:

MessageAnalysis MessageSCCAnalyzer::GetSCCAnalysis(const SCC* scc) {
  auto it = analysis_cache_.find(scc);
  if (it != analysis_cache_.end()) return it->second;

  MessageAnalysis result;
  if (UsingImplicitWeakFields(scc->GetFile(), options_)) {
    result.contains_weak = true;
  }
  for (size_t i = 0; i < scc->descriptors.size(); ++i) {
    const Descriptor* descriptor = scc->descriptors[i];
    if (descriptor->extension_range_count() > 0) {
      result.contains_extension = true;
    }
    for (int j = 0; j < descriptor->field_count(); j++) {
      const FieldDescriptor* field = descriptor->field(j);
      if (field->is_required()) {
        result.contains_required = true;
      }
      if (field->options().weak()) {
        result.contains_weak = true;
      }
      switch (field->type()) {
        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_BYTES: {
          if (field->cpp_string_type() ==
              FieldDescriptor::CppStringType::kCord) {
            result.contains_cord = true;
          }
          break;
        }
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE: {
          const SCC* child = analyzer_.GetSCC(field->message_type());
          if (child != scc) {
            MessageAnalysis analysis = GetSCCAnalysis(child);
            result.contains_cord |= analysis.contains_cord;
            result.contains_extension |= analysis.contains_extension;
            if (!ShouldIgnoreRequiredFieldCheck(field, options_)) {
              result.contains_required |= analysis.contains_required;
            }
            result.contains_weak |= analysis.contains_weak;
          } else {
            // This field points back into the same SCC hence the messages
            // in the SCC are recursive. Note if SCC contains more than two
            // nodes it has to be recursive, however this test also works for
            // a single node that is recursive.
            result.is_recursive = true;
          }
          break;
        }
        default:
          break;
      }
    }
  }
  // We deliberately only insert the result here. After we contracted the SCC
  // in the graph, the graph should be a DAG. Hence we shouldn't need to mark
  // nodes visited as we can never return to them. By inserting them here
  // we will go in an infinite loop if the SCC is not correct.
  return analysis_cache_[scc] = std::move(result);
}